

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_handler.c
# Opt level: O0

soHandle_t lh_load_lib(char *libName)

{
  undefined8 uVar1;
  long in_RDI;
  soHandle_t h;
  soHandle_t local_8;
  
  if (in_RDI == 0) {
    printf("ERROR in %s: ","lh_load_lib");
    printf("no library name given");
    printf("\n");
    local_8 = (soHandle_t)0x0;
  }
  else {
    local_8 = (soHandle_t)dlopen(in_RDI,1);
    if (local_8 == (soHandle_t)0x0) {
      printf("ERROR in %s: ","lh_load_lib");
      uVar1 = dlerror();
      printf("Error while loading dynamic library %s: %s",in_RDI,uVar1);
      printf("\n");
    }
  }
  return local_8;
}

Assistant:

soHandle_t lh_load_lib(const char *libName) {
    soHandle_t h = OSQP_NULL;

    if (!libName) {
        #ifdef PRINTING
        c_eprint("no library name given");
        #endif
        return OSQP_NULL;
    }

#ifdef IS_WINDOWS
    h = LoadLibrary (libName);
    if (!h) {
        #ifdef PRINTING
        c_eprint("Windows error while loading dynamic library %s, error = %d",
                libName, (int)GetLastError());
        #endif
    }
#else
    h = dlopen (libName, RTLD_LAZY);
    if (!h) {
        #ifdef PRINTING
        c_eprint("Error while loading dynamic library %s: %s", libName, dlerror());
        #endif
    }
#endif

    return h;
}